

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O1

string * __thiscall libtorrent::http_parser::header_abi_cxx11_(http_parser *this,string_view key)

{
  const_iterator cVar1;
  _Base_ptr p_Var2;
  key_type local_50;
  
  if (header[abi:cxx11](boost::basic_string_view<char,std::char_traits<char>>)::empty_abi_cxx11_ ==
      '\0') {
    header_abi_cxx11_();
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,key.ptr_,key.ptr_ + key.len_);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->m_header)._M_t,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  p_Var2 = (_Base_ptr)
           &header[abi:cxx11](boost::basic_string_view<char,std::char_traits<char>>)::
            empty_abi_cxx11_;
  if ((_Rb_tree_header *)cVar1._M_node != &(this->m_header)._M_t._M_impl.super__Rb_tree_header) {
    p_Var2 = cVar1._M_node + 2;
  }
  return (string *)p_Var2;
}

Assistant:

std::string const& http_parser::header(string_view const key) const
	{
		static std::string const empty;
		// TODO: remove to_string() if we're in C++14
		auto const i = m_header.find(key.to_string());
		if (i == m_header.end()) return empty;
		return i->second;
	}